

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xml.cpp
# Opt level: O1

void __thiscall
ORPG::Core::XMLElement::add_attribute(XMLElement *this,string *name,string *value,int line)

{
  pointer pcVar1;
  int iVar2;
  XMLAttribute *pXVar3;
  XMLAttribute *pXVar4;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar5;
  _Alloc_hider _Var6;
  bool bVar7;
  string local_f0;
  long *local_d0;
  size_t local_c8;
  long local_c0 [2];
  string local_b0;
  string local_90;
  string local_70;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_50 [2];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_40;
  
  if (this->root == (XMLAttribute *)0x0) {
    pXVar4 = (XMLAttribute *)operator_new(0x50);
    paVar5 = &local_70.field_2;
    pcVar1 = (name->_M_dataplus)._M_p;
    local_70._M_dataplus._M_p = (pointer)paVar5;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_70,pcVar1,pcVar1 + name->_M_string_length);
    pcVar1 = (value->_M_dataplus)._M_p;
    local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_b0,pcVar1,pcVar1 + value->_M_string_length);
    XMLAttribute::XMLAttribute(pXVar4,&local_70,&local_b0,line);
    this->root = pXVar4;
    _Var6._M_p = local_70._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
      operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
      _Var6._M_p = local_70._M_dataplus._M_p;
    }
  }
  else {
    pXVar4 = this->root;
    do {
      pXVar3 = pXVar4;
      pcVar1 = (pXVar3->name)._M_dataplus._M_p;
      local_d0 = local_c0;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_d0,pcVar1,pcVar1 + (pXVar3->name)._M_string_length);
      bVar7 = true;
      if (local_c8 == name->_M_string_length) {
        if (local_c8 == 0) {
          bVar7 = false;
        }
        else {
          iVar2 = bcmp(local_d0,(name->_M_dataplus)._M_p,local_c8);
          bVar7 = iVar2 != 0;
        }
      }
      if (local_d0 != local_c0) {
        operator_delete(local_d0,local_c0[0] + 1);
      }
      if (!bVar7) {
        paVar5 = &local_40;
        pcVar1 = (value->_M_dataplus)._M_p;
        local_50[0] = paVar5;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_50,pcVar1,pcVar1 + value->_M_string_length);
        std::__cxx11::string::_M_assign((string *)&pXVar3->value);
        _Var6._M_p = (pointer)local_50[0];
        goto LAB_00106b53;
      }
      pXVar4 = pXVar3->next;
    } while (pXVar3->next != (XMLAttribute *)0x0);
    pXVar4 = (XMLAttribute *)operator_new(0x50);
    paVar5 = &local_90.field_2;
    pcVar1 = (name->_M_dataplus)._M_p;
    local_90._M_dataplus._M_p = (pointer)paVar5;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_90,pcVar1,pcVar1 + name->_M_string_length);
    pcVar1 = (value->_M_dataplus)._M_p;
    local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_f0,pcVar1,pcVar1 + value->_M_string_length);
    XMLAttribute::XMLAttribute(pXVar4,&local_90,&local_f0,line);
    pXVar3->next = pXVar4;
    _Var6._M_p = local_90._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
      operator_delete(local_f0._M_dataplus._M_p,local_f0.field_2._M_allocated_capacity + 1);
      _Var6._M_p = local_90._M_dataplus._M_p;
    }
  }
LAB_00106b53:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)_Var6._M_p != paVar5) {
    operator_delete(_Var6._M_p,paVar5->_M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void XMLElement::add_attribute(std::string name, std::string value, int line) {
    if(root == nullptr) {
        root = new XMLAttribute(name, value, line);
    } else {
        XMLAttribute* curr = root;
        while(curr != nullptr) {
            if(curr->get_name() != name) {
                // we made it to the end of the attribute list and did not find
                // a match, so lets add it to the list
                if(curr->get_next() == nullptr) {
                    curr->next = new XMLAttribute(name, value, line);
                    break;
                }

                curr = curr->get_next();
            } else {
                // found it
                //TODO(incomingstick): update line number?
                curr->set_value(value);
                break;
            }
        }
    }
}